

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O3

bool tcu::isGatherCompareResultValid
               (TextureCubeView *texture,Sampler *sampler,TexComparePrecision *prec,Vec3 *coord,
               float cmpReference,Vec4 *result)

{
  CubeFace CVar1;
  int dim;
  ConstPixelBufferAccess *pCVar2;
  TextureFormat TVar3;
  undefined8 uVar4;
  int iVar5;
  Sampler *pSVar6;
  undefined4 coord_00;
  undefined4 coord_01;
  bool bVar7;
  CmpResultSet CVar8;
  ConstPixelBufferAccess **ppCVar9;
  long lVar10;
  int iVar11;
  ConstPixelBufferAccess **ppCVar12;
  int offNdx;
  Vec3 *coord_02;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  CubeFaceIntCoords CVar19;
  int numPossibleFaces;
  Vec2 vBounds;
  Vec2 uBounds;
  CubeFace possibleFaces [6];
  ConstPixelBufferAccess faces [6];
  int local_194;
  float local_190;
  float local_18c;
  float local_188;
  float local_184;
  ConstPixelBufferAccess **local_180;
  Sampler *local_178;
  CubeFaceIntCoords local_16c;
  Vec3 *local_160;
  long local_158;
  Vec4 *local_150;
  CubeFace local_148 [8];
  undefined1 local_128 [16];
  undefined1 auStack_118 [16];
  undefined8 auStack_108 [27];
  
  local_194 = 0;
  local_178 = sampler;
  local_150 = result;
  TexVerifierUtil::getPossibleCubeFaces(coord,&prec->coordBits,local_148,&local_194);
  bVar7 = true;
  if (local_194 != 0) {
    if (local_194 < 1) {
      bVar7 = false;
    }
    else {
      ppCVar12 = texture->m_levels;
      local_158 = 0;
      local_180 = ppCVar12;
      local_160 = coord;
      do {
        CVar1 = local_148[local_158];
        coord_02 = (Vec3 *)(ulong)CVar1;
        projectToFace((CubeFace)local_128,coord_02);
        coord_01 = local_128._4_4_;
        coord_00 = local_128._0_4_;
        bVar7 = isFixedPointDepthTextureFormat(&ppCVar12[(long)coord_02]->m_format);
        pSVar6 = local_178;
        dim = (ppCVar12[(long)coord_02]->m_size).m_data[0];
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&local_188,local_178->normalizedCoords,dim,(float)coord_00,
                   (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&local_190,pSVar6->normalizedCoords,dim,(float)coord_01,
                   (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
        fVar13 = local_188 + -0.5;
        fVar14 = local_184 + -0.5;
        fVar15 = local_190 + -0.5;
        fVar16 = local_18c + -0.5;
        lVar10 = 0;
        do {
          ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)(local_128 + lVar10));
          lVar10 = lVar10 + 0x28;
        } while (lVar10 != 0xf0);
        fVar13 = floorf(fVar13);
        fVar15 = floorf(fVar15);
        ppCVar12 = local_180;
        lVar10 = 0;
        ppCVar9 = local_180;
        do {
          pCVar2 = *ppCVar9;
          *(void **)(local_128 + lVar10 * 8 + 0x20) = pCVar2->m_data;
          TVar3 = pCVar2->m_format;
          uVar4 = *(undefined8 *)(pCVar2->m_size).m_data;
          *(undefined1 (*) [16])(local_128 + lVar10 * 8 + 0x10) =
               *(undefined1 (*) [16])((pCVar2->m_size).m_data + 2);
          *(TextureFormat *)(local_128 + (lVar10 * 2 + -2) * 4 + 8) = TVar3;
          *(undefined8 *)(local_128 + lVar10 * 8 + 8) = uVar4;
          lVar10 = lVar10 + 5;
          ppCVar9 = ppCVar9 + 1;
        } while (lVar10 != 0x1e);
        fVar14 = floorf(fVar14);
        fVar16 = floorf(fVar16);
        iVar11 = (int)fVar15;
        if (iVar11 <= (int)fVar16) {
          iVar5 = (int)fVar13;
          ppCVar12 = local_180;
          do {
            for (; local_180 = ppCVar12, iVar5 <= (int)fVar14; iVar5 = iVar5 + 1) {
              if (isGatherCompareResultValid(tcu::TextureCubeView_const&,tcu::Sampler_const&,tcu::TexComparePrecision_const&,tcu::CubeFaceCoords<float>const&,float,tcu::Vector<float,int>const&)
                  ::offsets == '\0') {
                isGatherCompareResultValid();
              }
              lVar10 = 0;
              while( true ) {
                local_16c.s = (&isGatherCompareResultValid(tcu::TextureCubeView_const&,tcu::Sampler_const&,tcu::TexComparePrecision_const&,tcu::CubeFaceCoords<float>const&,float,tcu::Vector<float,int>const&)
                                ::offsets)[lVar10 * 2] + iVar5;
                local_16c.t = (&DAT_00d48814)[lVar10 * 2] + iVar11;
                local_16c.face = CVar1;
                CVar19 = remapCubeEdgeCoords(&local_16c,dim);
                if ((ulong)CVar19.face == 6) {
                  return true;
                }
                fVar15 = ConstPixelBufferAccess::getPixDepth
                                   ((ConstPixelBufferAccess *)
                                    (local_128 + (ulong)CVar19.face * 0x28),CVar19.s,CVar19.t,0);
                CVar8 = execCompare(local_178->compare,fVar15,cmpReference,prec->referenceBits,bVar7
                                   );
                fVar15 = local_150->m_data[lVar10];
                fVar17 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
                fVar18 = fVar15 - fVar17;
                fVar15 = fVar15 + fVar17;
                if ((((((ushort)CVar8 & 1) == 0) || (1.0 < fVar18)) || (fVar15 < 1.0)) &&
                   ((((ushort)CVar8 >> 8 & 1) == 0 || (0.0 < fVar18 || fVar15 < 0.0)))) break;
                lVar10 = lVar10 + 1;
                if (lVar10 == 4) {
                  return true;
                }
              }
              ppCVar12 = local_180;
            }
            iVar11 = iVar11 + 1;
            iVar5 = (int)fVar13;
          } while (iVar11 <= (int)fVar16);
        }
        local_158 = local_158 + 1;
        bVar7 = false;
      } while (local_158 < local_194);
    }
  }
  return bVar7;
}

Assistant:

bool isGatherCompareResultValid (const TextureCubeView&			texture,
								 const Sampler&					sampler,
								 const TexComparePrecision&		prec,
								 const Vec3&					coord,
								 float							cmpReference,
								 const Vec4&					result)
{
	int			numPossibleFaces				= 0;
	CubeFace	possibleFaces[CUBEFACE_LAST];

	DE_ASSERT(isSamplerSupported(sampler));

	getPossibleCubeFaces(coord, prec.coordBits, &possibleFaces[0], numPossibleFaces);

	if (numPossibleFaces == 0)
		return true; // Result is undefined.

	for (int tryFaceNdx = 0; tryFaceNdx < numPossibleFaces; tryFaceNdx++)
	{
		const CubeFaceFloatCoords faceCoords(possibleFaces[tryFaceNdx], projectToFace(possibleFaces[tryFaceNdx], coord));

		if (isGatherCompareResultValid(texture, sampler, prec, faceCoords, cmpReference, result))
			return true;
	}

	return false;
}